

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_decode_status(int *pstatus,char *s,size_t len)

{
  char cVar1;
  int local_34;
  int local_2c;
  int iStack_28;
  char c;
  int i;
  int status;
  CURLcode result;
  size_t len_local;
  char *s_local;
  int *pstatus_local;
  
  i = 0x2b;
  iStack_28 = 0;
  if (len == 3) {
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      cVar1 = s[local_2c];
      if ((cVar1 < '0') || ('9' < cVar1)) goto LAB_001534dc;
      iStack_28 = cVar1 + -0x30 + iStack_28 * 10;
    }
    i = 0;
  }
LAB_001534dc:
  if (i == 0) {
    local_34 = iStack_28;
  }
  else {
    local_34 = -1;
  }
  *pstatus = local_34;
  return i;
}

Assistant:

CURLcode Curl_http_decode_status(int *pstatus, const char *s, size_t len)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  int status = 0;
  int i;

  if(len != 3)
    goto out;

  for(i = 0; i < 3; ++i) {
    char c = s[i];

    if(c < '0' || c > '9')
      goto out;

    status *= 10;
    status += c - '0';
  }
  result = CURLE_OK;
out:
  *pstatus = result ? -1 : status;
  return result;
}